

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_handle_graph.cpp
# Opt level: O3

size_t __thiscall
handlegraph::PathHandleGraph::get_step_count(PathHandleGraph *this,handle_t *handle)

{
  size_t count;
  size_t local_38;
  undefined1 **local_30;
  undefined8 local_28;
  code *local_20;
  code *local_18;
  undefined1 *local_10;
  
  local_10 = (undefined1 *)&local_38;
  local_38 = 0;
  local_30 = &local_10;
  local_28 = 0;
  local_18 = std::
             _Function_handler<bool_(const_handlegraph::step_handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<bool_(const_handlegraph::step_handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
             ::_M_manager;
  (**(code **)(*(long *)this + 0x130))();
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,3);
  }
  return local_38;
}

Assistant:

size_t PathHandleGraph::get_step_count(const handle_t& handle) const {
    size_t count = 0;
    for_each_step_on_handle(handle, [&](const step_handle_t& step) {
        ++count;
    });
    return count;
}